

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ralocal.cpp
# Opt level: O1

uint32_t __thiscall
asmjit::v1_14::RALocalAllocator::decideOnSpillFor
          (RALocalAllocator *this,RegGroup group,uint32_t workId,RegMask spillableRegs,
          uint32_t *spillWorkId)

{
  uint **ppuVar1;
  uint **ppuVar2;
  byte bVar3;
  uint uVar4;
  uint uVar5;
  long lVar6;
  WorkToPhysMap *pWVar7;
  BaseCompiler *pBVar8;
  PhysToWorkMap *pPVar9;
  PhysToWorkMap *pPVar10;
  uint *puVar11;
  uint *puVar12;
  uint *puVar13;
  uint uVar14;
  RegGroup RVar15;
  uint uVar16;
  Error EVar17;
  RABlock *pRVar18;
  uint uVar19;
  ulong uVar20;
  RABlock *block;
  uint uVar21;
  ulong unaff_RBX;
  long lVar22;
  undefined7 in_register_00000031;
  BaseNode *pBVar23;
  InstNode *node;
  RALocalAllocator *this_00;
  uint uVar24;
  ulong uVar25;
  ulong unaff_R12;
  ulong unaff_R13;
  uint uVar26;
  InstNode *pIVar27;
  bool bVar28;
  undefined4 uStack_d8;
  undefined4 uStack_d4;
  undefined4 uStack_d0;
  undefined4 uStack_cc;
  undefined8 uStack_c8;
  undefined8 uStack_c0;
  ulong uStack_b0;
  ulong uStack_a8;
  ulong uStack_a0;
  RALocalAllocator *pRStack_98;
  InstNode *pIStack_90;
  long lStack_88;
  Error EStack_7c;
  ulong uStack_78;
  RALocalAllocator *pRStack_70;
  InstNode *pIStack_68;
  BaseNode *pBStack_60;
  ulong uStack_58;
  ulong uStack_50;
  
  pBVar23 = (BaseNode *)CONCAT71(in_register_00000031,group);
  if (spillableRegs == 0) {
LAB_00124fda:
    decideOnSpillFor();
  }
  else if (group < kPC) {
    uVar16 = 0;
    if (spillableRegs != 0) {
      for (; (spillableRegs >> uVar16 & 1) == 0; uVar16 = uVar16 + 1) {
      }
    }
    pBVar23 = (BaseNode *)(this->_curAssignment)._physToWorkIds._data[group];
    uVar19 = *(uint *)(pBVar23 + (ulong)uVar16 * 4);
    uVar20 = (ulong)uVar19;
    uVar24 = spillableRegs - 1 & spillableRegs;
    if (uVar24 == 0) {
LAB_00124fc9:
      *spillWorkId = uVar19;
      return uVar16;
    }
    uVar4 = *(uint *)&this->_pass->field_0x148;
    if (uVar19 < uVar4) {
      lVar22 = *(long *)&this->_pass->_workRegs;
      uVar21 = (uint)(*(float *)(*(long *)(lVar22 + uVar20 * 8) + 100) * 1048576.0);
      uVar5 = (((this->_curAssignment)._physToWorkMap)->dirty)._masks._data[group];
      this = (RALocalAllocator *)(ulong)uVar5;
      uVar19 = uVar21 + 0x40000;
      if ((uVar5 >> (uVar16 & 0x1f) & 1) == 0) {
        uVar19 = uVar21;
      }
      uVar25 = (ulong)uVar19;
      do {
        uVar21 = 0;
        if (uVar24 != 0) {
          for (; (uVar24 >> uVar21 & 1) == 0; uVar21 = uVar21 + 1) {
          }
        }
        unaff_RBX = (ulong)uVar21;
        uVar19 = *(uint *)(pBVar23 + unaff_RBX * 4);
        if (uVar4 <= uVar19) {
          decideOnSpillFor();
          goto LAB_00124fda;
        }
        uVar26 = (uint)(*(float *)(*(long *)(lVar22 + (ulong)uVar19 * 8) + 100) * 1048576.0);
        uVar14 = uVar26 + 0x40000;
        if ((uVar5 >> (uVar21 & 0x1f) & 1) == 0) {
          uVar14 = uVar26;
        }
        unaff_R12 = (ulong)uVar14;
        bVar28 = uVar14 < (uint)uVar25;
        if (bVar28) {
          uVar20 = (ulong)uVar19;
          uVar25 = unaff_R12;
        }
        uVar19 = (uint)uVar20;
        if (bVar28) {
          uVar16 = uVar21;
        }
        uVar24 = uVar24 - 1 & uVar24;
      } while (uVar24 != 0);
      goto LAB_00124fc9;
    }
    goto LAB_00124fe4;
  }
  decideOnSpillFor();
LAB_00124fe4:
  decideOnSpillFor();
  uVar20 = *(ulong *)(pBVar23 + 0x20);
  node = (InstNode *)(ulong)*(uint *)(uVar20 + 0x10);
  if (node != (InstNode *)0x0) {
    pRStack_70 = (RALocalAllocator *)&this->_curAssignment;
    lVar22 = uVar20 + 0x54;
    pIVar27 = (InstNode *)0x0;
    this_00 = this;
    pIStack_68 = node;
    pBStack_60 = pBVar23;
    uStack_58 = unaff_RBX;
    uStack_50 = unaff_R12;
    do {
      if ((InstNode *)(ulong)*(uint *)(uVar20 + 0x10) <= pIVar27) {
        lStack_88 = 0x125140;
        spillAfterAllocation();
LAB_00125140:
        lStack_88 = 0x125145;
        spillAfterAllocation();
LAB_00125145:
        lStack_88 = 0x12514a;
        spillAfterAllocation();
LAB_0012514a:
        lStack_88 = 0x12514f;
        spillAfterAllocation();
LAB_0012514f:
        lStack_88 = 0x125154;
        spillAfterAllocation();
LAB_00125154:
        lStack_88 = 0x125159;
        spillAfterAllocation();
        (this_00->_cc->super_BaseBuilder)._cursor = *(BaseNode **)node;
        uStack_b0 = uVar20;
        uStack_a8 = unaff_R12;
        uStack_a0 = unaff_R13;
        pRStack_98 = this;
        pIStack_90 = pIVar27;
        lStack_88 = lVar22;
        if (*(PhysToWorkMap **)(block + 200) != (PhysToWorkMap *)0x0) {
          EVar17 = switchToAssignment(this_00,*(PhysToWorkMap **)(block + 200),
                                      (ZoneBitVector *)(block + 0x78),
                                      SUB41((*(uint *)(block + 0xc) & 8) >> 3,0),true);
          uVar20 = (ulong)EVar17;
          if (EVar17 != 0) {
            return EVar17;
          }
        }
        EVar17 = allocInst(this_00,node);
        if (EVar17 != 0) {
          return EVar17;
        }
        uVar16 = *(uint *)(block + 0xb8);
        if ((ulong)uVar16 == 0xffffffff) {
          pRVar18 = block + 0xbc;
LAB_001251fe:
          EVar17 = spillScratchGpRegsBeforeEntry(this_00,*(RegMask *)pRVar18);
          if (EVar17 != 0) {
            return EVar17;
          }
          if (*(long *)(block + 200) == 0) {
            EVar17 = BaseRAPass::setBlockEntryAssignment
                               (this_00->_pass,block,this_00->_block,&this_00->_curAssignment);
            if (EVar17 != 0) {
              return EVar17;
            }
            goto LAB_001253c0;
          }
          pBVar23 = *(BaseNode **)this_00->_pass->_extraBlock;
          pRVar18 = (RABlock *)BaseBuilder::setCursor(&this_00->_cc->super_BaseBuilder,pBVar23);
          pWVar7 = (this_00->_curAssignment)._workToPhysMap;
          memcpy((this_00->_tmpAssignment)._physToWorkMap,(this_00->_curAssignment)._physToWorkMap,
                 (ulong)(this_00->_tmpAssignment)._layout.physTotal * 4 + 0x20);
          memcpy((this_00->_tmpAssignment)._workToPhysMap,pWVar7,
                 (ulong)(this_00->_tmpAssignment)._layout.workCount);
          bVar28 = false;
          EVar17 = switchToAssignment(this_00,*(PhysToWorkMap **)(block + 200),
                                      (ZoneBitVector *)(block + 0x78),
                                      SUB41((*(uint *)(block + 0xc) & 8) >> 3,0),false);
          if (EVar17 != 0) goto LAB_001253bb;
          EVar17 = (Error)uVar20;
          if ((this_00->_cc->super_BaseBuilder)._cursor != pBVar23) {
            if ((uint)(byte)node[0x13] <= (byte)node[0x12] - 1) goto LAB_001253d8;
            lVar22 = (ulong)((byte)node[0x12] - 1) * 0x10;
            if ((*(uint *)(node + lVar22 + 0x40) & 7) != 5) goto LAB_001253dd;
            (*(this_00->_cc->super_BaseBuilder).super_BaseEmitter._vptr_BaseEmitter[4])(&uStack_d8);
            uStack_c8 = *(undefined8 *)(node + lVar22 + 0x40);
            uStack_c0 = *(undefined8 *)(node + lVar22 + 0x48);
            *(undefined4 *)(node + lVar22 + 0x40) = uStack_d8;
            *(undefined4 *)(node + lVar22 + 0x44) = uStack_d4;
            *(undefined4 *)(node + lVar22 + 0x48) = uStack_d0;
            *(undefined4 *)(node + lVar22 + 0x4c) = uStack_cc;
            node[0x34] = (InstNode)((byte)node[0x34] & 0xef);
            EVar17 = (*(this_00->_pass->super_FuncPass).super_Pass._vptr_Pass[0xd])();
            bVar28 = EVar17 == 0;
            if (bVar28) {
              pBVar8 = this_00->_cc;
              (pBVar8->super_BaseBuilder)._cursor = pBVar23;
              (*(pBVar8->super_BaseBuilder).super_BaseEmitter._vptr_BaseEmitter[6])
                        (pBVar8,&uStack_d8);
              EVar17 = (Error)uVar20;
            }
            goto LAB_00125340;
          }
        }
        else {
          if (uVar16 < *(uint *)(*(long *)block + 0xf0)) {
            pRVar18 = (RABlock *)((ulong)uVar16 * 0x20 + *(long *)(*(long *)block + 0xe8));
            goto LAB_001251fe;
          }
          allocBranch();
          pRVar18 = block;
LAB_001253d8:
          allocBranch();
LAB_001253dd:
          EVar17 = 3;
          bVar28 = false;
LAB_00125340:
          if (!bVar28) {
            bVar28 = false;
            goto LAB_001253bb;
          }
        }
        (this_00->_cc->super_BaseBuilder)._cursor = (BaseNode *)pRVar18;
        pWVar7 = (this_00->_curAssignment)._workToPhysMap;
        pPVar9 = (this_00->_curAssignment)._physToWorkMap;
        pPVar10 = (this_00->_tmpAssignment)._physToWorkMap;
        (this_00->_curAssignment)._workToPhysMap = (this_00->_tmpAssignment)._workToPhysMap;
        (this_00->_curAssignment)._physToWorkMap = pPVar10;
        (this_00->_tmpAssignment)._workToPhysMap = pWVar7;
        (this_00->_tmpAssignment)._physToWorkMap = pPVar9;
        lVar22 = 0;
        do {
          ppuVar1 = (this_00->_curAssignment)._physToWorkIds._data + lVar22;
          puVar11 = *ppuVar1;
          puVar12 = ppuVar1[1];
          ppuVar2 = (this_00->_tmpAssignment)._physToWorkIds._data + lVar22;
          puVar13 = ppuVar2[1];
          ppuVar1 = (this_00->_curAssignment)._physToWorkIds._data + lVar22;
          *ppuVar1 = *ppuVar2;
          ppuVar1[1] = puVar13;
          ppuVar1 = (this_00->_tmpAssignment)._physToWorkIds._data + lVar22;
          *ppuVar1 = puVar11;
          ppuVar1[1] = puVar12;
          lVar22 = lVar22 + 2;
        } while (lVar22 != 4);
        bVar28 = true;
LAB_001253bb:
        if (bVar28) {
LAB_001253c0:
          EVar17 = 0;
        }
        return EVar17;
      }
      bVar28 = true;
      if ((*(byte *)(lVar22 + 2) & 2) != 0) {
        uVar16 = *(uint *)(lVar22 + -8);
        unaff_R12 = (ulong)uVar16;
        if (*(uint *)&this->_pass->field_0x148 <= uVar16) goto LAB_00125140;
        lVar6 = *(long *)(*(long *)&this->_pass->_workRegs + unaff_R12 * 8);
        if (*(char *)(lVar6 + 0x4a) != -1) goto LAB_00125110;
        if (uVar16 == 0xffffffff) goto LAB_00125145;
        if ((this->_curAssignment)._layout.workCount <= uVar16) goto LAB_0012514a;
        bVar3 = (this->_curAssignment)._workToPhysMap[unaff_R12].physIds[0];
        unaff_R13 = (ulong)bVar3;
        if (bVar3 == 0xff) goto LAB_00125110;
        RVar15 = *(RegGroup *)(lVar6 + 0x21);
        (this->_cc->super_BaseBuilder)._cursor = pBStack_60;
        if (0x1f < bVar3) goto LAB_0012514f;
        RVar15 = RVar15 & kMaxValue;
        if (kExtraVirt3 < RVar15) goto LAB_00125154;
        if (((((this->_curAssignment)._physToWorkMap)->dirty)._masks._data[RVar15] >> (bVar3 & 0x1f)
            & 1) == 0) {
LAB_001250e9:
          lStack_88 = 0x1250f9;
          this_00 = pRStack_70;
          RAAssignment::unassign((RAAssignment *)pRStack_70,RVar15,uVar16,(uint)bVar3);
          EVar17 = 0;
        }
        else {
          lStack_88 = 0x1250e0;
          this_00 = this;
          uStack_78 = (ulong)RVar15;
          EVar17 = onSaveReg(this,RVar15,uVar16,(uint)bVar3);
          RVar15 = (RegGroup)uStack_78;
          if (EVar17 == 0) goto LAB_001250e9;
        }
        bVar28 = EVar17 == 0;
        node = pIStack_68;
        if (!bVar28) {
          EStack_7c = EVar17;
        }
      }
LAB_00125110:
      if (!bVar28) {
        return EStack_7c;
      }
      pIVar27 = pIVar27 + 1;
      lVar22 = lVar22 + 0x20;
    } while (node != pIVar27);
  }
  return 0;
}

Assistant:

uint32_t RALocalAllocator::decideOnSpillFor(RegGroup group, uint32_t workId, RegMask spillableRegs, uint32_t* spillWorkId) const noexcept {
  // May be used in the future to decide which register would be best to spill so `workId` can be assigned.
  DebugUtils::unused(workId);
  ASMJIT_ASSERT(spillableRegs != 0);

  Support::BitWordIterator<RegMask> it(spillableRegs);
  uint32_t bestPhysId = it.next();
  uint32_t bestWorkId = _curAssignment.physToWorkId(group, bestPhysId);

  // Avoid calculating the cost model if there is only one spillable register.
  if (it.hasNext()) {
    uint32_t bestCost = calculateSpillCost(group, bestWorkId, bestPhysId);
    do {
      uint32_t localPhysId = it.next();
      uint32_t localWorkId = _curAssignment.physToWorkId(group, localPhysId);
      uint32_t localCost = calculateSpillCost(group, localWorkId, localPhysId);

      if (localCost < bestCost) {
        bestCost = localCost;
        bestPhysId = localPhysId;
        bestWorkId = localWorkId;
      }
    } while (it.hasNext());
  }

  *spillWorkId = bestWorkId;
  return bestPhysId;
}